

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,4,4>,tcu::Vector<float,4>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  ostringstream *poVar2;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  pointer pVVar5;
  pointer pVVar6;
  Variable<tcu::Vector<float,_4>_> *pVVar7;
  pointer pcVar8;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar9;
  undefined7 uVar10;
  PrecisionCase *pPVar11;
  ulong uVar12;
  FloatFormat *fmt;
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  ContextType type;
  int iVar16;
  _Rb_tree_node_base *p_Var17;
  char *pcVar18;
  size_t sVar19;
  long *plVar20;
  ShaderExecutor *pSVar21;
  long lVar22;
  IVal *pIVar23;
  IVal *pIVar24;
  IVal *pIVar25;
  TestError *this_00;
  uint uVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  undefined1 *puVar28;
  Vector<float,_4> *val;
  Interval *__return_storage_ptr__;
  double dVar29;
  long lVar30;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  *pVVar31;
  byte bVar32;
  IVal in2;
  IVal in3;
  IVal in1;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  outputs;
  FuncSet funcs;
  ostringstream oss;
  ostringstream os;
  ShaderSpec spec;
  PrecisionCase *local_598;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  *local_590;
  string local_588;
  ulong local_560;
  Statement *local_558;
  ulong local_550;
  string local_548;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_528;
  long local_520;
  undefined1 local_518 [16];
  undefined1 local_508 [104];
  double dStack_4a0;
  double local_498;
  Interval IStack_490;
  ulong local_478;
  FloatFormat *local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_468;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  local_438;
  undefined1 local_408 [16];
  _Base_ptr local_3f8;
  _Rb_tree_node_base *local_3f0;
  _Rb_tree_node_base *local_3e8;
  double local_3e0;
  undefined1 auStack_3b8 [8];
  undefined8 uStack_3b0;
  undefined1 local_3a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  double local_388;
  Precision local_380;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_378;
  undefined4 local_370;
  ios_base local_338 [8];
  ios_base local_330 [264];
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  VarType local_208 [3];
  ios_base local_1b8 [8];
  ios_base local_1b0 [264];
  undefined1 local_a8 [56];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  bVar32 = 0;
  pVVar5 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  dVar29 = (double)((long)pVVar6 - (long)pVVar5 >> 4);
  local_590 = variables;
  local_558 = stmt;
  local_528 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Vector<float,_4>_>_>
  ::Outputs(&local_438,(size_t)dVar29);
  local_70._M_p = (pointer)&local_60;
  local_a8._0_4_ = GLSL_VERSION_300_ES;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  local_a8._32_8_ = (pointer)0x0;
  local_a8._40_8_ = (pointer)0x0;
  local_a8._48_8_ = (pointer)0x0;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  IStack_490.m_lo = (this->m_ctx).highpFormat.m_maxValue;
  local_508._96_8_ = *(undefined8 *)&(this->m_ctx).highpFormat;
  dStack_4a0 = *(double *)&(this->m_ctx).highpFormat.m_fractionBits;
  local_498 = *(double *)&(this->m_ctx).highpFormat.m_hasInf;
  IStack_490.m_hasNaN = (this->m_ctx).highpFormat.m_exactPrecision;
  IStack_490._1_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_468._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_468._M_impl.super__Rb_tree_header._M_header;
  local_468._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_468._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_468._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_228._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_228 + 8);
  local_468._M_impl.super__Rb_tree_header._M_header._M_right =
       local_468._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Statement: ",0xb);
  (*local_558->_vptr_Statement[2])(local_558,poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_598 = this;
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_1b0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
  p_Var3 = (_Rb_tree_node_base *)(local_408 + 8);
  local_408._8_4_ = _S_red;
  local_3f8 = (_Base_ptr)0x0;
  local_3e0 = 0.0;
  local_3f0 = p_Var3;
  local_3e8 = p_Var3;
  (*local_558->_vptr_Statement[4])(local_558,local_408);
  if (local_3f0 != p_Var3) {
    p_Var17 = local_3f0;
    do {
      (**(code **)(**(long **)(p_Var17 + 1) + 0x30))(*(long **)(p_Var17 + 1),local_3a8);
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != p_Var3);
  }
  pPVar11 = local_598;
  if (local_3e0 != 0.0) {
    local_228._0_8_ = ((local_598->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_228 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(char *)local_518._0_8_,local_518._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_518._0_8_ != (IVal *)local_508) {
      operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_1b0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_408);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
  std::ios_base::~ios_base(local_338);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"precision ",10);
  pcVar18 = glu::getPrecisionName((pPVar11->m_ctx).precision);
  if (pcVar18 == (char *)0x0) {
    std::ios::clear((int)((long)&local_598 + *(long *)(local_228._0_8_ + -0x18)) + 0x370);
  }
  else {
    sVar19 = strlen(pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar18,sVar19);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_70,(string *)local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._0_8_ != &local_398) {
    operator_delete((void *)local_3a8._0_8_,
                    CONCAT44(local_398._M_allocated_capacity._4_4_,
                             local_398._M_allocated_capacity._0_4_) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  type.super_ApiType.m_bits = (ApiType)(*((pPVar11->m_ctx).renderContext)->_vptr_RenderContext[2])()
  ;
  pVVar31 = local_590;
  local_a8._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_598->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                   "#extension ",&local_598->m_extension);
    plVar20 = (long *)std::__cxx11::string::append(local_3a8);
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar20 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar20 == paVar27) {
      local_218._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_218._8_8_ = plVar20[3];
      local_228._0_8_ = &local_218;
    }
    else {
      local_218._M_allocated_capacity = paVar27->_M_allocated_capacity;
      local_228._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar20;
    }
    local_228._8_8_ = plVar20[1];
    *plVar20 = (long)paVar27;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &local_218) {
      operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
    }
    pVVar31 = local_590;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._0_8_ != &local_398) {
      operator_delete((void *)local_3a8._0_8_,
                      CONCAT44(local_398._M_allocated_capacity._4_4_,
                               local_398._M_allocated_capacity._0_4_) + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 8),1);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_228,local_598,
             (pVVar31->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar13 = local_a8._8_8_;
  std::__cxx11::string::operator=((string *)local_a8._8_8_,(string *)local_228);
  glu::VarType::operator=((VarType *)(uVar13 + 0x20),local_208);
  glu::VarType::~VarType(local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._0_8_ != &local_218) {
    operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 0x20),2);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_228,local_598,
             (local_590->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar13 = local_a8._32_8_;
  std::__cxx11::string::operator=((string *)(local_a8._32_8_ + 0x38),(string *)local_228);
  glu::VarType::operator=(&((pointer)(uVar13 + 0x38))->varType,local_208);
  glu::VarType::~VarType(local_208);
  pVVar31 = local_590;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._0_8_ != &local_218) {
    operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,4,4>>
            ((Symbol *)local_228,local_598,
             (pVVar31->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr);
  uVar13 = local_a8._32_8_;
  std::__cxx11::string::operator=((string *)local_a8._32_8_,(string *)local_228);
  glu::VarType::operator=((VarType *)(uVar13 + 0x20),local_208);
  glu::VarType::~VarType(local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._0_8_ != &local_218) {
    operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  pPVar11 = local_598;
  (*local_558->_vptr_Statement[2])(local_558,local_228);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  std::ios_base::~ios_base(local_1b8);
  std::__cxx11::string::operator=((string *)&local_50,(string *)local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._0_8_ != &local_398) {
    operator_delete((void *)local_3a8._0_8_,
                    CONCAT44(local_398._M_allocated_capacity._4_4_,
                             local_398._M_allocated_capacity._0_4_) + 1);
  }
  pSVar21 = ShaderExecUtil::createExecutor
                      ((pPVar11->m_ctx).renderContext,(pPVar11->m_ctx).shaderType,
                       (ShaderSpec *)local_a8);
  local_228._0_8_ =
       (local_528->in0).
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_228._8_8_ =
       (local_528->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_218._M_allocated_capacity =
       (size_type)
       (local_528->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_218._8_8_ =
       (local_528->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a8._0_8_ =
       local_438.out0.
       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_3a8._8_8_ =
       local_438.out1.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar21->_vptr_ShaderExecutor[3])
            (pSVar21,((pPVar11->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar16 = (*pSVar21->_vptr_ShaderExecutor[2])(pSVar21);
  if ((char)iVar16 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar21->_vptr_ShaderExecutor[5])(pSVar21);
  (*pSVar21->_vptr_ShaderExecutor[6])(pSVar21,(ulong)dVar29 & 0xffffffff,local_228,local_3a8);
  local_470 = &(pPVar11->m_ctx).floatFormat;
  local_508._80_8_ = dVar29;
  (*pSVar21->_vptr_ShaderExecutor[1])(pSVar21);
  pVVar31 = local_590;
  lVar22 = 0x10;
  do {
    auStack_3b8[lVar22] = 0;
    *(undefined8 *)((long)&uStack_3b0 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_3a8 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x70);
  lVar22 = 0x10;
  do {
    auStack_3b8[lVar22] = 0;
    *(undefined8 *)((long)&uStack_3b0 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_3a8 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x70);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_228);
  lVar22 = 0x10;
  do {
    local_408[lVar22 + -0x10] = 0;
    *(undefined8 *)(local_408 + lVar22 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_408 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x70);
  lVar22 = 0x10;
  do {
    local_408[lVar22 + -0x10] = 0;
    *(undefined8 *)(local_408 + lVar22 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_408 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x70);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_468,
             (pVVar31->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_3a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_468,
             (pVVar31->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_518);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_468,
             (pVVar31->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_588);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_468,
             (pVVar31->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_548);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_468,
             (pVVar31->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr,(IVal *)local_228);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_468,
             (pVVar31->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_408);
  if (pVVar6 == pVVar5) {
    local_550 = 0;
  }
  else {
    local_508._88_8_ = &local_598->m_status;
    local_478 = local_508._80_8_ + (ulong)((double)local_508._80_8_ == 0.0);
    local_560 = 0;
    local_550 = 0;
    do {
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_228);
      lVar22 = 0x10;
      do {
        local_408[lVar22 + -0x10] = 0;
        *(undefined8 *)(local_408 + lVar22 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_408 + lVar22) = 0xfff0000000000000;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x70);
      lVar22 = 0x10;
      do {
        local_408[lVar22 + -0x10] = 0;
        *(undefined8 *)(local_408 + lVar22 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_408 + lVar22) = 0xfff0000000000000;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x70);
      if ((local_560 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_598->super_TestCase).super_TestNode.m_testCtx);
      }
      fmt = local_470;
      local_520 = local_560 * 0x10;
      pVVar5 = (local_528->in0).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + local_560;
      local_588._M_dataplus._M_p = *(pointer *)pVVar5->m_data;
      local_588._M_string_length = *(size_type *)(pVVar5->m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_518,local_470,(Vector<float,_4> *)&local_588);
      pVVar31 = local_590;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_3a8,fmt,(IVal *)local_518);
      pIVar23 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_468,
                           (pVVar31->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pIVar24 = (IVal *)local_3a8;
      for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
        uVar10 = *(undefined7 *)&pIVar24->m_data[0].field_0x1;
        pIVar23->m_data[0].m_hasNaN = pIVar24->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar23->m_data[0].field_0x1 = uVar10;
        pIVar24 = (IVal *)((long)pIVar24 + ((ulong)bVar32 * -2 + 1) * 8);
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar32 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_468,
                 (pVVar31->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_468,
                 (pVVar31->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_468,
                 (pVVar31->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_380 = (local_598->m_ctx).precision;
      local_388 = fmt->m_maxValue;
      local_3a8._0_8_ = *(undefined8 *)fmt;
      local_3a8._8_8_ = *(undefined8 *)&fmt->m_fractionBits;
      local_398._M_allocated_capacity._0_4_ = fmt->m_hasInf;
      local_398._M_allocated_capacity._4_4_ = fmt->m_hasNaN;
      local_398._8_4_ = *(undefined4 *)&fmt->m_exactPrecision;
      local_398._12_4_ = *(undefined4 *)&fmt->field_0x1c;
      local_370 = 0;
      local_378 = &local_468;
      (*local_558->_vptr_Statement[3])(local_558,(IVal *)local_3a8);
      pIVar24 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_468,
                           (pVVar31->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_3a8,(FloatFormat *)(local_508 + 0x60),pIVar24);
      pIVar24 = (IVal *)local_3a8;
      pIVar23 = (IVal *)local_408;
      for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
        uVar10 = *(undefined7 *)&pIVar24->m_data[0].field_0x1;
        pIVar23->m_data[0].m_hasNaN = pIVar24->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar23->m_data[0].field_0x1 = uVar10;
        pIVar24 = (IVal *)((long)pIVar24 + ((ulong)bVar32 * -2 + 1) * 8);
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar32 * -2 + 1) * 8);
      }
      bVar14 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_408,
                          (Vector<float,_4> *)
                          ((long)(local_438.out1.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + local_520));
      local_3a8._0_8_ = &local_398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"Shader output 1 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check
                         ((ResultCollector *)local_508._88_8_,bVar14,(string *)local_3a8);
      pVVar31 = local_590;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._0_8_ != &local_398) {
        operator_delete((void *)local_3a8._0_8_,
                        CONCAT44(local_398._M_allocated_capacity._4_4_,
                                 local_398._M_allocated_capacity._0_4_) + 1);
      }
      pIVar25 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_468,
                           (pVVar31->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      __return_storage_ptr__ = (Interval *)local_3a8;
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)__return_storage_ptr__,(FloatFormat *)(local_508 + 0x60),pIVar25);
      uVar12 = local_560;
      puVar28 = local_228;
      lVar22 = 0;
      do {
        lVar30 = 0;
        do {
          *(undefined8 *)(puVar28 + lVar30 + 0x10) =
               *(undefined8 *)((long)&__return_storage_ptr__->m_hi + lVar30);
          pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&__return_storage_ptr__->m_hasNaN)
                    ->m_data[0].m_data[0].m_hasNaN + lVar30;
          dVar29 = *(double *)(pbVar1 + 8);
          *(undefined8 *)(puVar28 + lVar30) = *(undefined8 *)pbVar1;
          *(double *)((long)(puVar28 + lVar30) + 8) = dVar29;
          lVar30 = lVar30 + 0x60;
        } while (lVar30 != 0x180);
        lVar22 = lVar22 + 1;
        puVar28 = puVar28 + 0x18;
        __return_storage_ptr__ = __return_storage_ptr__ + 1;
      } while (lVar22 != 4);
      bVar15 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_228,
                          (Matrix<float,_4,_4> *)
                          ((long)local_438.out0.
                                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_560 * 4 * 0x10));
      local_3a8._0_8_ = &local_398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"Shader output 0 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check
                         ((ResultCollector *)local_508._88_8_,bVar15,(string *)local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._0_8_ != &local_398) {
        operator_delete((void *)local_3a8._0_8_,
                        CONCAT44(local_398._M_allocated_capacity._4_4_,
                                 local_398._M_allocated_capacity._0_4_) + 1);
      }
      uVar26 = (int)local_550 + ((byte)~(bVar14 && bVar15) & 1);
      local_550 = (ulong)uVar26;
      if ((int)uVar26 < 0x65 && (!bVar14 || !bVar15)) {
        local_3a8._0_8_ = ((local_598->super_TestCase).super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_3a8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        pcVar18 = "Failed";
        if (bVar14 && bVar15) {
          pcVar18 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,pcVar18,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\t",1);
        pVVar7 = (local_590->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        val = (Vector<float,_4> *)local_508;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_518._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_518,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_3a8 + 8),(char *)local_518._0_8_,local_518._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_3a8 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_588,(BuiltinPrecisionTests *)(local_508 + 0x60),
                   (FloatFormat *)
                   ((long)((local_528->in0).
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_520),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_3a8 + 8),local_588._M_dataplus._M_p,local_588._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_3a8 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<float,_4> *)local_518._0_8_ != (Vector<float,_4> *)local_508) {
          operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_3a8 + 8),"\t",1);
        pVVar9 = (local_590->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                 .m_ptr;
        pIVar25 = (IVal *)local_508;
        pcVar8 = (pVVar9->m_name)._M_dataplus._M_p;
        local_518._0_8_ = pIVar25;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_518,pcVar8,pcVar8 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_3a8 + 8),(char *)local_518._0_8_,local_518._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_3a8 + 8)," = ",3);
        valueToString<tcu::Matrix<float,4,4>>
                  (&local_588,(BuiltinPrecisionTests *)(local_508 + 0x60),
                   (FloatFormat *)
                   ((long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar12 * 4 * 0x10),
                   (Matrix<float,_4,_4> *)pIVar25);
        poVar4 = (ostream *)(local_3a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_588._M_dataplus._M_p,local_588._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,4>>
                  (&local_548,(BuiltinPrecisionTests *)(local_508 + 0x60),(FloatFormat *)local_228,
                   pIVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_548._M_dataplus._M_p,local_548._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_518._0_8_ != (IVal *)local_508) {
          operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        pVVar7 = (local_590->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        pIVar24 = (IVal *)local_508;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_518._0_8_ = pIVar24;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_518,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        poVar4 = (ostream *)(local_3a8 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(char *)local_518._0_8_,local_518._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_588,(BuiltinPrecisionTests *)(local_508 + 0x60),
                   (FloatFormat *)
                   ((long)(local_438.out1.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_520),
                   (Vector<float,_4> *)pIVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_588._M_dataplus._M_p,local_588._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_548,(BuiltinPrecisionTests *)(local_508 + 0x60),(FloatFormat *)local_408,
                   pIVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,local_548._M_dataplus._M_p,local_548._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_518._0_8_ != (IVal *)local_508) {
          operator_delete((void *)local_518._0_8_,local_508._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_3a8 + 8));
        std::ios_base::~ios_base(local_330);
      }
      local_560 = local_560 + 1;
    } while (local_560 != local_478);
  }
  pPVar11 = local_598;
  iVar16 = (int)local_550;
  if (100 < iVar16) {
    local_228._0_8_ = ((local_598->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_228 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(Skipped ",9);
    std::ostream::operator<<(poVar2,iVar16 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_1b0);
  }
  if (iVar16 == 0) {
    local_228._0_8_ = ((pPVar11->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_228 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_228._0_8_ = ((pPVar11->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_228 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::ostream::operator<<(poVar2,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_228,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_228 + 8));
  std::ios_base::~ios_base(local_1b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 8));
  if (local_438.out1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.out0.
         super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_438.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}